

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CESkyCoord.cpp
# Opt level: O2

CESkyCoord * __thiscall CESkyCoord::operator=(CESkyCoord *this,CESkyCoord *other)

{
  if (this != other) {
    init_members(this);
    copy_members(this,other);
  }
  return this;
}

Assistant:

CESkyCoord& CESkyCoord::operator=(const CESkyCoord& other)
{
    if (this != &other) {
        free_members();
        init_members();
        copy_members(other);
    }
    return *this;
}